

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O3

void __thiscall
ON_ComponentManifestTableIndex::RemoveAllItems
          (ON_ComponentManifestTableIndex *this,bool bResetManifestIndex)

{
  ON_ComponentManifestItem_PRIVATE **__s;
  long lVar1;
  
  __s = (this->m_item_list).m_a;
  if ((__s != (ON_ComponentManifestItem_PRIVATE **)0x0) &&
     (lVar1 = (long)(this->m_item_list).m_capacity, 0 < lVar1)) {
    memset(__s,0,lVar1 << 3);
  }
  if ((bResetManifestIndex) && (-1 < (this->m_item_list).m_capacity)) {
    (this->m_item_list).m_count = 0;
  }
  this->m_deleted_item_count = 0;
  this->m_system_item_count = 0;
  this->m_active_and_deleted_item_count = 0;
  this->m_first_item = (ON_ComponentManifestItem_PRIVATE *)0x0;
  this->m_last_item = (ON_ComponentManifestItem_PRIVATE *)0x0;
  this->m_first_system_item = (ON_ComponentManifestItem_PRIVATE *)0x0;
  this->m_last_system_item = (ON_ComponentManifestItem_PRIVATE *)0x0;
  return;
}

Assistant:

void ON_ComponentManifestTableIndex::RemoveAllItems(
  bool bResetManifestIndex
  )
{
  m_item_list.Zero();
  if ( bResetManifestIndex )
    m_item_list.SetCount(0);
  
  m_active_and_deleted_item_count = 0;
  m_deleted_item_count = 0;

  m_first_item = nullptr;
  m_last_item = nullptr;

  m_system_item_count = 0;
  m_first_system_item = nullptr;
  m_last_system_item = nullptr;
}